

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_init(uv_loop_t *loop,uv_udp_t *handle)

{
  int iVar1;
  uv_udp_t *handle_local;
  uv_loop_t *loop_local;
  
  iVar1 = uv_udp_init_ex(loop,handle,0);
  return iVar1;
}

Assistant:

int uv_udp_init(uv_loop_t* loop, uv_udp_t* handle) {
  return uv_udp_init_ex(loop, handle, AF_UNSPEC);
}